

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writebmp.cpp
# Opt level: O0

void writeBMP(char *filename,float *data,int W,int H,float outputgamma)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  __type_conflict _Var2;
  int unaff_retaddr;
  int unaff_retaddr_00;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int i;
  char *bytedata;
  double in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  int local_34 [3];
  void *local_28;
  int local_18;
  int local_14;
  
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_28 = operator_new__((long)(in_EDX * in_ECX * 3));
  for (local_34[2] = 0;
      SBORROW4(local_34[2],local_14 * local_18 * 3) != local_34[2] + local_14 * local_18 * -3 < 0;
      local_34[2] = local_34[2] + 1) {
    local_34[1] = 0xff;
    _Var2 = std::pow<float,double>
                      ((float)((ulong)in_stack_ffffffffffffffc0 >> 0x20),in_stack_ffffffffffffffb8);
    local_34[0] = (int)(_Var2 * 255.0);
    piVar1 = std::min<int>(local_34 + 1,local_34);
    *(char *)((long)local_28 + (long)local_34[2]) = (char)*piVar1;
  }
  writeBMP(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
  if (local_28 != (void *)0x0) {
    operator_delete__(local_28);
  }
  return;
}

Assistant:

void writeBMP(const char* filename, float* data, int W, int H, float outputgamma = 2.2)
// data: RGB, top left -> bottom right, no padding
{
	char* bytedata = new char[W*H*3];
	for (int i=0; i<W*H*3; ++i)
		bytedata[i] = std::min(255, int(std::pow(data[i],1.0/outputgamma) *255));
	writeBMP(filename, bytedata, W, H);
	delete[] bytedata;
}